

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O0

void __thiscall
skiplist<double,_std::less<double>_>::cake_iterator<false>::cake_iterator
          (cake_iterator<false> *this,SLNode<double> *node_)

{
  SLNode<double> *node__local;
  cake_iterator<false> *this_local;
  
  this->node = node_;
  this->node_count_ = 0;
  this->node_count_ref_ = 0;
  if (node_ != (SLNode<double> *)0x0) {
    this->node_count_ = node_->count + -1;
    this->node_count_ref_ = this->node_count_;
  }
  this->reverse_ = false;
  return;
}

Assistant:

cake_iterator(SLNode<val_type> *node_) : node(node_) {
        // check iterator constructor for explanation
        node_count_ = 0;
        node_count_ref_ = 0;

        if(node_) {
            node_count_ = node_->count - 1;
            node_count_ref_ = node_count_;
        }
        reverse_ = reversal;
    }